

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.cpp
# Opt level: O3

void __thiscall SkipList::SkipList(SkipList *this)

{
  uint uVar1;
  ulong uVar2;
  Node *pNVar3;
  size_t __i;
  long lVar4;
  
  std::random_device::random_device(&this->rd);
  uVar1 = std::random_device::_M_getval();
  uVar2 = (ulong)uVar1;
  (this->mt)._M_x[0] = uVar2;
  lVar4 = 1;
  do {
    uVar2 = (ulong)(((uint)(uVar2 >> 0x1e) ^ (uint)uVar2) * 0x6c078965 + (int)lVar4);
    (this->mt)._M_x[lVar4] = uVar2;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x270);
  (this->mt)._M_p = 0x270;
  pNVar3 = (Node *)operator_new(0x38);
  pNVar3->right = (Node *)0x0;
  pNVar3->down = (Node *)0x0;
  pNVar3->key = 0;
  (pNVar3->value)._M_dataplus._M_p = (pointer)&(pNVar3->value).field_2;
  (pNVar3->value)._M_string_length = 0;
  (pNVar3->value).field_2._M_local_buf[0] = '\0';
  this->head = pNVar3;
  this->length = 0;
  this->valueSize = 0;
  return;
}

Assistant:

SkipList::SkipList()
    : rd(), mt(rd()), head(new Node), length(0), valueSize(0) {}